

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  LogMessage *pLVar1;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if ((this->backup_bytes_ != 0) ||
     ((this->buffer_)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xfc);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: backup_bytes_ == 0 && buffer_.get() != NULL: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1," BackUp() can only be called after Next().");
    internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if (this->buffer_used_ < count) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xfe);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (count) <= (buffer_used_): ")
    ;
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        " Can\'t back up over more bytes than were returned by the last call to Next()."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x101);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (count) >= (0): ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1," Parameter to BackUp() can\'t be negative.");
    internal::LogFinisher::operator=(&local_91,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  this->backup_bytes_ = count;
  return;
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  GOOGLE_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
      << " BackUp() can only be called after Next().";
  GOOGLE_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";
  GOOGLE_CHECK_GE(count, 0) << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}